

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_7bit_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (size == 0) {
    return 0xfffffffffffffffe;
  }
  uVar4 = (part->encstate).bufend - (part->encstate).bufbeg;
  if (uVar4 == 0) {
    return 0;
  }
  if (uVar4 < size) {
    size = uVar4;
  }
  sVar3 = size + (size == 0);
  uVar4 = 0;
  do {
    cVar2 = (part->encstate).buf[(part->encstate).bufbeg];
    buffer[uVar4] = cVar2;
    if (cVar2 < '\0') {
      return -(ulong)(uVar4 == 0) | uVar4;
    }
    psVar1 = &(part->encstate).bufbeg;
    *psVar1 = *psVar1 + 1;
    uVar4 = uVar4 + 1;
  } while (sVar3 != uVar4);
  return sVar3;
}

Assistant:

static size_t encoder_7bit_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t cursize = st->bufend - st->bufbeg;

  (void) ateof;

  if(!size)
    return STOP_FILLING;

  if(size > cursize)
    size = cursize;

  for(cursize = 0; cursize < size; cursize++) {
    *buffer = st->buf[st->bufbeg];
    if(*buffer++ & 0x80)
      return cursize ? cursize : READ_ERROR;
    st->bufbeg++;
  }

  return cursize;
}